

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int moveto_snode(lyxp_set *set,lys_node *cur_node,char *qname,uint16_t qname_len,int options)

{
  uint32_t uVar1;
  ly_ctx *ctx;
  lyxp_set *plVar2;
  lyxp_set_type lVar3;
  int iVar4;
  int iVar5;
  lys_module *moveto_mod;
  long lVar6;
  lys_module *module;
  lys_node *plVar7;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  uint uVar11;
  bool bVar12;
  lyxp_node_type local_44;
  int local_40;
  lyxp_node_type root_type;
  lyxp_set *local_38;
  
  uVar8 = (ulong)qname_len;
  lVar3 = set->type;
  local_40 = options;
  switch(lVar3) {
  case LYXP_SET_EMPTY:
    goto switchD_0016db83_caseD_0;
  case LYXP_SET_NODE_SET:
    pcVar9 = "node set";
    break;
  case LYXP_SET_SNODE_SET:
    ctx = cur_node->module->ctx;
    local_38 = set;
    moveto_snode_get_root(cur_node,options,&local_44);
    pcVar9 = strnchr(qname,0x3a,(uint)qname_len);
    if (pcVar9 == (char *)0x0) {
      moveto_mod = (lys_module *)0x0;
LAB_0016dc4b:
      pcVar9 = lydict_insert(ctx,qname,uVar8 & 0xffff);
      uVar1 = local_38->used;
      lVar6 = (long)(int)uVar1;
      if (lVar6 < 1) {
        lydict_remove(ctx,pcVar9);
      }
      else {
        lVar10 = 0;
        root_type = LYXP_NODE_ROOT;
        iVar5 = local_40;
        do {
          if ((local_38->val).nodes[lVar10].pos == 1) {
            (local_38->val).nodes[lVar10].pos = 0;
            if ((local_38->val).nodes[lVar10].type < LYXP_NODE_ELEM) {
              plVar7 = (lys_node *)0x0;
              while( true ) {
                module = moveto_mod;
                if (moveto_mod == (lys_module *)0x0) {
                  module = lys_node_module((lys_node *)(local_38->val).nodes[lVar10].node);
                }
                plVar7 = lys_getnext(plVar7,(lys_node *)0x0,module,0);
                if (plVar7 == (lys_node *)0x0) break;
                iVar4 = moveto_snode_check(plVar7,local_44,pcVar9,moveto_mod,iVar5);
                if (iVar4 == 0) {
                  iVar4 = set_snode_insert_node(local_38,plVar7,LYXP_NODE_ELEM);
                  if (lVar10 < iVar4 && iVar4 < (int)uVar1) {
                    (local_38->val).nodes[iVar4].pos = 2;
                    root_type = LYXP_NODE_ROOT_CONFIG;
                  }
                }
              }
            }
            else {
              plVar7 = (lys_node *)(local_38->val).nodes[lVar10].node;
              if ((plVar7->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
                plVar7 = lys_getnext((lys_node *)0x0,plVar7,(lys_module *)0x0,0);
                while (plVar7 != (lys_node *)0x0) {
                  iVar5 = moveto_snode_check(plVar7,local_44,pcVar9,moveto_mod,iVar5);
                  plVar2 = local_38;
                  if (iVar5 == 0) {
                    iVar5 = set_snode_insert_node(local_38,plVar7,LYXP_NODE_ELEM);
                    if (lVar10 < iVar5 && iVar5 < (int)uVar1) {
                      (plVar2->val).nodes[iVar5].pos = 2;
                      root_type = LYXP_NODE_ROOT_CONFIG;
                    }
                  }
                  plVar7 = lys_getnext(plVar7,(lys_node *)(plVar2->val).nodes[lVar10].node,
                                       (lys_module *)0x0,0);
                  iVar5 = local_40;
                }
              }
            }
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != lVar6);
        bVar12 = root_type != LYXP_NODE_ROOT;
        lydict_remove(ctx,pcVar9);
        if (bVar12 && 0 < (int)uVar1) {
          lVar10 = 0;
          do {
            if (*(int *)((long)&((local_38->val).nodes)->pos + lVar10) == 2) {
              *(undefined4 *)((long)&((local_38->val).nodes)->pos + lVar10) = 1;
            }
            lVar10 = lVar10 + 0x10;
          } while (lVar6 << 4 != lVar10);
        }
      }
      return 0;
    }
    uVar11 = (int)pcVar9 - (int)qname;
    moveto_mod = moveto_resolve_model(qname,(uint16_t)uVar11,ctx,cur_node,options);
    if (moveto_mod != (lys_module *)0x0) {
      qname = qname + (long)(int)uVar11 + 1;
      uVar8 = (ulong)(~uVar11 + (uint)qname_len);
      goto LAB_0016dc4b;
    }
    ly_vlog(LYE_XPATH_INMOD,LY_VLOG_NONE,(void *)0x0,(ulong)uVar11,qname);
    goto LAB_0016dc34;
  case LYXP_SET_BOOLEAN:
    pcVar9 = "boolean";
    break;
  case LYXP_SET_NUMBER:
    pcVar9 = "number";
    break;
  case LYXP_SET_STRING:
    pcVar9 = "string";
    break;
  default:
    pcVar9 = (char *)0x0;
  }
  ly_vlog(LYE_XPATH_INOP_1,LY_VLOG_NONE,(void *)0x0,"path operator",pcVar9);
LAB_0016dc34:
  lVar3 = ~LYXP_SET_EMPTY;
switchD_0016db83_caseD_0:
  return lVar3;
}

Assistant:

static int
moveto_snode(struct lyxp_set *set, struct lys_node *cur_node, const char *qname, uint16_t qname_len, int options)
{
    int i, orig_used, pref_len, idx, temp_ctx = 0;
    const char *ptr, *name_dict = NULL; /* optimalization - so we can do (==) instead (!strncmp(...)) in moveto_node_check() */
    struct lys_module *moveto_mod;
    const struct lys_node *sub;
    struct ly_ctx *ctx;
    enum lyxp_node_type root_type;

    if (!set || (set->type == LYXP_SET_EMPTY)) {
        return EXIT_SUCCESS;
    }

    if (set->type != LYXP_SET_SNODE_SET) {
        LOGVAL(LYE_XPATH_INOP_1, LY_VLOG_NONE, NULL, "path operator", print_set_type(set));
        return -1;
    }

    ctx = cur_node->module->ctx;
    moveto_snode_get_root(cur_node, options, &root_type);

    /* prefix */
    if ((ptr = strnchr(qname, ':', qname_len))) {
        pref_len = ptr - qname;
        moveto_mod = moveto_resolve_model(qname, pref_len, ctx, cur_node, 1);
        if (!moveto_mod) {
            LOGVAL(LYE_XPATH_INMOD, LY_VLOG_NONE, NULL, pref_len, qname);
            return -1;
        }
        qname += pref_len + 1;
        qname_len -= pref_len + 1;
    } else {
        moveto_mod = NULL;
    }

    /* name */
    name_dict = lydict_insert(ctx, qname, qname_len);

    orig_used = set->used;
    for (i = 0; i < orig_used; ++i) {
        if (set->val.snodes[i].in_ctx != 1) {
            continue;
        }
        set->val.snodes[i].in_ctx = 0;

        if ((set->val.snodes[i].type == LYXP_NODE_ROOT_CONFIG) || (set->val.snodes[i].type == LYXP_NODE_ROOT)) {
            /* it can actually be in any module, it's all <running>, but we know it's moveto_mod (if set),
             * so use it directly (root node itself is useless in this case) */
            sub = NULL;
            while ((sub = lys_getnext(sub, NULL, (moveto_mod ? moveto_mod : lys_node_module(set->val.snodes[i].snode)), 0))) {
                if (!moveto_snode_check(sub, root_type, name_dict, moveto_mod, options)) {
                    idx = set_snode_insert_node(set, sub, LYXP_NODE_ELEM);
                    /* we need to prevent these nodes to be considered in this moveto */
                    if ((idx < orig_used) && (idx > i)) {
                        set->val.snodes[idx].in_ctx = 2;
                        temp_ctx = 1;
                    }
                }
            }

        /* skip nodes without children - leaves, leaflists, and anyxmls (ouput root will eval to true) */
        } else if (!(set->val.snodes[i].snode->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA))) {
            sub = NULL;
            while ((sub = lys_getnext(sub, set->val.snodes[i].snode, NULL, 0))) {
                if (!moveto_snode_check(sub, root_type, name_dict, moveto_mod, options)) {
                    idx = set_snode_insert_node(set, sub, LYXP_NODE_ELEM);
                    if ((idx < orig_used) && (idx > i)) {
                        set->val.snodes[idx].in_ctx = 2;
                        temp_ctx = 1;
                    }
                }
            }
        }
    }
    lydict_remove(ctx, name_dict);

    /* correct temporary in_ctx values */
    if (temp_ctx) {
        for (i = 0; i < orig_used; ++i) {
            if (set->val.snodes[i].in_ctx == 2) {
                set->val.snodes[i].in_ctx = 1;
            }
        }
    }

    return EXIT_SUCCESS;
}